

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O1

void __thiscall Plane::Plane(Plane *this,double a,double b,double c,double d)

{
  double dVar1;
  
  GeometricObject::GeometricObject(&this->super_GeometricObject);
  (this->super_GeometricObject)._vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_00108be0
  ;
  (this->normal).x = a;
  (this->normal).y = b;
  (this->normal).z = c;
  dVar1 = c * c + a * a + b * b;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  (this->normal).x = (this->normal).x / dVar1;
  (this->normal).y = (this->normal).y / dVar1;
  (this->normal).z = (this->normal).z / dVar1;
  this->dist = d / dVar1;
  return;
}

Assistant:

Plane::Plane( double a, double b, double c,  double d )
{
   normal = Vector(a,b,c);
   double norm = !normal;

   normal /= norm;
   dist = d / norm;
}